

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseTracking::TrackerBase::fail(TrackerBase *this)

{
  TrackerContext *pTVar1;
  ITracker *pIVar2;
  
  this->m_runState = Failed;
  if (this->m_parent == (ITracker *)0x0) {
    pIVar2 = (ITracker *)0x0;
  }
  else {
    (*this->m_parent->_vptr_ITracker[10])();
    pIVar2 = this->m_parent;
  }
  pTVar1 = this->m_ctx;
  pTVar1->m_currentTracker = pIVar2;
  pTVar1->m_runState = CompletedCycle;
  return;
}

Assistant:

void TrackerBase::fail() {
        m_runState = Failed;
        if( m_parent )
            m_parent->markAsNeedingAnotherRun();
        moveToParent();
        m_ctx.completeCycle();
    }